

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye_model.hpp
# Opt level: O2

void __thiscall
FisheyeModel::calibrate
          (FisheyeModel *this,
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          *object_points_list,
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          *image_points_list,Size *image_size,Size *board_size,Size *square_size,int flags,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detected_image_list,string *model_filename)

{
  double avg_reproj_error;
  double dVar1;
  TermCriteria TVar2;
  ostream *poVar3;
  vector<double,_std::allocator<double>_> image_reproj_errors;
  vector<cv::Mat,_std::allocator<cv::Mat>_> tvecs;
  vector<cv::Mat,_std::allocator<cv::Mat>_> rvecs;
  string local_170;
  _InputOutputArray local_150;
  Mat camera_matrix;
  Mat distort_coeffs;
  _OutputArray local_78;
  _OutputArray local_60;
  _InputOutputArray local_48;
  
  cv::Mat::Mat(&camera_matrix);
  cv::Mat::Mat(&distort_coeffs);
  local_60.super__InputArray.obj = &rvecs;
  rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__InputArray.obj = &tvecs;
  tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_170.field_2._M_allocated_capacity = 0;
  rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_170._M_dataplus._M_p._0_4_ = 0x81040015;
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150.super__OutputArray.super__InputArray.sz.width = 0;
  local_150.super__OutputArray.super__InputArray.sz.height = 0;
  local_150.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_48.super__OutputArray.super__InputArray.sz.width = 0;
  local_48.super__OutputArray.super__InputArray.sz.height = 0;
  local_48.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_60.super__InputArray.sz.width = 0;
  local_60.super__InputArray.sz.height = 0;
  local_60.super__InputArray.flags = 0x2050000;
  local_78.super__InputArray.sz.width = 0;
  local_78.super__InputArray.sz.height = 0;
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x8104000d);
  local_78.super__InputArray.flags = 0x2050000;
  TVar2.epsilon = 0.0001;
  TVar2.type = 3;
  TVar2.maxCount = 200;
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)image_points_list;
  local_170._M_string_length = (size_type)object_points_list;
  local_150.super__OutputArray.super__InputArray.obj = &camera_matrix;
  local_48.super__OutputArray.super__InputArray.obj = &distort_coeffs;
  avg_reproj_error =
       (double)cv::fisheye::calibrate
                         ((_InputArray *)&local_170,(_InputArray *)&image_reproj_errors,
                          (Size_ *)image_size,&local_150,&local_48,&local_60,&local_78,flags,TVar2);
  std::operator<<((ostream *)&std::cout,"=== Root Mean Square Error ===\n");
  poVar3 = std::ostream::_M_insert<double>(avg_reproj_error);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"=== Camera Matrix ===\n");
  cv::operator<<(poVar3,&camera_matrix);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"=== Distance Coefficients ===\n");
  cv::operator<<(poVar3,&distort_coeffs);
  std::operator<<(poVar3,"\n");
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = computeReprojectionErrors
                    (this,object_points_list,image_points_list,&rvecs,&tvecs,&camera_matrix,
                     &distort_coeffs,&image_reproj_errors);
  std::operator<<((ostream *)&std::cout,"=== Recalculted Root Mean Square Error ===\n");
  poVar3 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::string((string *)&local_170,"fisheye_model",(allocator *)&local_150);
  BaseModel::saveParamsToXML
            (&this->super_BaseModel,&local_170,&camera_matrix,0.0,&distort_coeffs,flags,
             avg_reproj_error,image_size,board_size,square_size,detected_image_list,
             image_points_list,&rvecs,&tvecs,&image_reproj_errors,model_filename);
  std::__cxx11::string::~string((string *)&local_170);
  BaseModel::loadParamsFromXML(&this->super_BaseModel,model_filename);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&tvecs);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&rvecs);
  cv::Mat::~Mat(&distort_coeffs);
  cv::Mat::~Mat(&camera_matrix);
  return;
}

Assistant:

void calibrate(
    const std::vector<std::vector<cv::Point3f>>& object_points_list,
    const std::vector<std::vector<cv::Point2f>>& image_points_list,
    const cv::Size& image_size,
    const cv::Size& board_size,
    const cv::Size& square_size,
    const int flags,
    const std::vector<std::string>& detected_image_list,
    const std::string& model_filename
  ) {
    cv::Mat camera_matrix, distort_coeffs;
    std::vector<cv::Mat> rvecs, tvecs;
    
    double avg_reproj_error = cv::fisheye::calibrate(
      object_points_list,
      image_points_list,
      image_size,
      camera_matrix,
      distort_coeffs,
      rvecs,
      tvecs,
      flags,
      cv::TermCriteria(cv::TermCriteria::COUNT+cv::TermCriteria::EPS, 200, 0.0001)
    );
    std::cout << "=== Root Mean Square Error ===\n" << avg_reproj_error << "\n";
    std::cout << "=== Camera Matrix ===\n" << camera_matrix << "\n";
    std::cout << "=== Distance Coefficients ===\n" << distort_coeffs << "\n";

    std::vector<double> image_reproj_errors;
    double _avg_reproj_error = this->computeReprojectionErrors(
      object_points_list,
      image_points_list,
      rvecs,
      tvecs,
      camera_matrix,
      distort_coeffs,
      image_reproj_errors
    );
    std::cout << "=== Recalculted Root Mean Square Error ===\n" << _avg_reproj_error << "\n";

    this->saveParamsToXML(
      "fisheye_model",
      camera_matrix,
      0,
      distort_coeffs,
      flags,
      avg_reproj_error,
      image_size,
      board_size,
      square_size,
      detected_image_list,
      image_points_list,
      rvecs,
      tvecs,
      image_reproj_errors,
      model_filename
    );
    
    this->loadParamsFromXML(model_filename);
  }